

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpReg3B1<Js::OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data_local;
  OpCode op_local;
  
  DumpReg(data->R0);
  DumpReg(data->R1);
  DumpReg(data->R2);
  DumpI4((uint)data->B3);
  return;
}

Assistant:

void
    ByteCodeDumper::DumpReg3B1(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpReg(data->R0);
        DumpReg(data->R1);
        DumpReg(data->R2);
        DumpI4(data->B3);
    }